

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketClient.cpp
# Opt level: O1

int __thiscall SocketClient::connect(SocketClient *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  int *piVar2;
  uint7 uVar3;
  undefined4 in_register_00000034;
  shared_ptr<SocketClient> *args;
  SharedPtr loop;
  SharedPtr unixSocket;
  anon_union_110_2_e6918d59 anon_var_0;
  Error local_b8;
  undefined4 uStack_b4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b0;
  shared_ptr<SocketClient> local_a8;
  sockaddr local_98;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined6 uStack_40;
  undefined2 local_3a;
  undefined6 uStack_38;
  undefined8 uStack_32;
  
  iVar1 = init(this,(EVP_PKEY_CTX *)0x4);
  if ((char)iVar1 == '\0') {
    iVar1 = 0;
  }
  else {
    local_98.sa_data[6] = '\0';
    local_98.sa_data[7] = '\0';
    local_98.sa_data[8] = '\0';
    local_98.sa_data[9] = '\0';
    local_98.sa_data[10] = '\0';
    local_98.sa_data[0xb] = '\0';
    local_98.sa_data[0xc] = '\0';
    local_98.sa_data[0xd] = '\0';
    uStack_38 = 0;
    uStack_32 = 0;
    uStack_48 = 0;
    uStack_40 = 0;
    local_3a = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_78 = 0;
    uStack_70 = 0;
    local_88 = 0;
    uStack_80 = 0;
    local_98.sa_family = 1;
    local_98.sa_data[0] = '\0';
    local_98.sa_data[1] = '\0';
    local_98.sa_data[2] = '\0';
    local_98.sa_data[3] = '\0';
    local_98.sa_data[4] = '\0';
    local_98.sa_data[5] = '\0';
    strncpy(local_98.sa_data,*(char **)CONCAT44(in_register_00000034,__fd),0x6c);
    std::__shared_ptr<SocketClient,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<SocketClient,void>
              ((__shared_ptr<SocketClient,(__gnu_cxx::_Lock_policy)2> *)&local_a8,
               (__weak_ptr<SocketClient,_(__gnu_cxx::_Lock_policy)2> *)this);
    do {
      iVar1 = ::connect(this->mFd,&local_98,0x6e);
      if (iVar1 != -1) break;
      piVar2 = __errno_location();
    } while (*piVar2 == 4);
    std::__cxx11::string::_M_assign((string *)&this->mAddress);
    uVar3 = (uint7)(uint3)((uint)iVar1 >> 8);
    if (iVar1 == 0) {
      this->mSocketState = Connected;
      iVar1 = (int)CONCAT71(uVar3,1);
      Signal<std::function<void(std::shared_ptr<SocketClient>const&)>>::operator()
                ((Signal<std::function<void(std::shared_ptr<SocketClient>const&)>> *)
                 &this->signalConnected,&local_a8);
    }
    else {
      piVar2 = __errno_location();
      if (*piVar2 == 0x73) {
        EventLoop::eventLoop();
        if ((EventLoop *)CONCAT44(uStack_b4,local_b8) != (EventLoop *)0x0) {
          EventLoop::updateSocket((EventLoop *)CONCAT44(uStack_b4,local_b8),this->mFd,7);
          this->mWriteWait = true;
        }
        if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0);
        }
        this->mSocketState = Connecting;
        iVar1 = (int)CONCAT71(uVar3,1);
      }
      else {
        local_b8 = ConnectError;
        args = &local_a8;
        Signal<std::function<void(std::shared_ptr<SocketClient>const&,SocketClient::Error)>>::
        operator()((Signal<std::function<void(std::shared_ptr<SocketClient>const&,SocketClient::Error)>>
                    *)&this->mSignalError,args,&local_b8);
        close(this,(int)args);
        iVar1 = 0;
      }
    }
    if (local_a8.super___shared_ptr<SocketClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a8.super___shared_ptr<SocketClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
  }
  return iVar1;
}

Assistant:

bool SocketClient::connect(const String& path)
{
    if (!init(Unix))
        return false;

    union {
        sockaddr_un addr_un;
        sockaddr addr;
    };
    memset(&addr_un, '\0', sizeof(addr_un));
    addr_un.sun_family = AF_UNIX;
    strncpy(addr_un.sun_path, path.constData(), sizeof(addr_un.sun_path));

    SocketClient::SharedPtr unixSocket = shared_from_this();

    int e;
    eintrwrap(e, ::connect(mFd, &addr, sizeof(addr_un)));
    mAddress = path;
    if (e == 0) { // we're done
        mSocketState = Connected;

        signalConnected(unixSocket);
    } else {
        if (errno != EINPROGRESS) {
            // bad
            mSignalError(unixSocket, ConnectError);
            close();
            return false;
        }
        if (EventLoop::SharedPtr loop = EventLoop::eventLoop()) {
            loop->updateSocket(mFd, EventLoop::SocketRead|EventLoop::SocketWrite|EventLoop::SocketOneShot);
            mWriteWait = true;
        }
        mSocketState = Connecting;
    }
    return true;
}